

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::skip_space
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,char_type_conflict **ptr)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar5;
  int *piVar6;
  size_t sVar4;
  
  sVar2 = this->line_;
  sVar4 = this->position_;
  piVar5 = *ptr;
LAB_0032dd3e:
  do {
    sVar3 = sVar4 + 1;
    piVar6 = piVar5 + 1;
    if (this->end_input_ <= piVar5) {
LAB_0032ddaf:
      *ptr = piVar5;
      return;
    }
    iVar1 = *piVar5;
    if ((iVar1 == 9) || (iVar1 == 0x20)) {
      this->position_ = sVar3;
      sVar4 = sVar3;
      piVar5 = piVar6;
      goto LAB_0032dd3e;
    }
    if (iVar1 == 10) {
      this->line_ = sVar2 + 1;
LAB_0032dd90:
      this->position_ = sVar3;
    }
    else {
      if (iVar1 != 0xd) goto LAB_0032ddaf;
      this->position_ = sVar3;
      if (this->end_input_ <= piVar6) {
        push_state(this,this->state_);
        this->state_ = cr;
        piVar5 = piVar6;
        goto LAB_0032ddaf;
      }
      this->line_ = sVar2 + 1;
      if (*piVar6 == 10) {
        piVar6 = piVar5 + 2;
        sVar3 = sVar4 + 2;
        goto LAB_0032dd90;
      }
    }
    sVar2 = sVar2 + 1;
    this->mark_position_ = sVar3;
    sVar4 = sVar3;
    piVar5 = piVar6;
  } while( true );
}

Assistant:

void skip_space(char_type const ** ptr)
    {
        const char_type* local_input_end = end_input_;
        const char_type* cur = *ptr;

        while (cur < local_input_end) 
        {
            if (*cur == ' ' || *cur == '\t')
            {
                ++cur;
                ++position_;
                continue;
            }
            if (*cur == '\n')
            {
                ++cur;
                ++line_;
                ++position_;
                mark_position_ = position_;
                continue;
            }
            if (*cur == '\r')
            {
                ++cur;
                ++position_;
                if (cur < local_input_end)
                {
                    ++line_;
                    if (*cur == '\n')
                    {
                        ++cur;
                        ++position_;
                    }
                    mark_position_ = position_;
                }
                else
                {
                    push_state(state_);
                    state_ = parse_state::cr;
                    *ptr = cur;
                    return; 
                }
                continue;
            }
            break;
        }
        *ptr = cur;
    }